

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directives.cpp
# Opt level: O2

void dirABYTEC(void)

{
  int iVar1;
  undefined8 in_RAX;
  aint add;
  
  add = (aint)((ulong)in_RAX >> 0x20);
  iVar1 = ParseExpressionNoSyntaxError(&lp,&add);
  if (iVar1 == 0) {
    Error("ABYTEC <offset> <bytes>: parsing <offset> failed",bp,SUPPRESS);
  }
  else {
    Relocation::checkAndWarn(false);
    getBytesWithCheck(add,1,false);
  }
  return;
}

Assistant:

static void dirABYTEC() {
	aint add;
	if (ParseExpressionNoSyntaxError(lp, add)) {
		Relocation::checkAndWarn();
		getBytesWithCheck(add, 1);
	} else {
		Error("ABYTEC <offset> <bytes>: parsing <offset> failed", bp, SUPPRESS);
	}
}